

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_vertex_id.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_83b63::lower_vertex_id_visitor::visit
          (lower_vertex_id_visitor *this,ir_dereference_variable *ir)

{
  ir_variable_data *piVar1;
  undefined1 *puVar2;
  exec_list *peVar3;
  exec_node *peVar4;
  ir_function_signature *piVar5;
  void *mem_ctx;
  ir_variable *piVar6;
  operand rhs;
  ir_assignment *piVar7;
  exec_node *peVar8;
  operand local_40;
  operand local_38;
  deref local_30;
  
  if ((((undefined1  [44])ir->var->data & (undefined1  [44])0xf000) == (undefined1  [44])0xa000) &&
     ((ir->var->data).location == 9)) {
    piVar6 = this->VertexID;
    if (piVar6 == (ir_variable *)0x0) {
      mem_ctx = ralloc_parent(ir);
      piVar6 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
      ir_variable::ir_variable(piVar6,&glsl_type::_int_type,"__VertexID",ir_var_temporary);
      this->VertexID = piVar6;
      peVar3 = this->ir_list;
      peVar8 = &(piVar6->super_ir_instruction).super_exec_node;
      peVar4 = (peVar3->head_sentinel).next;
      (piVar6->super_ir_instruction).super_exec_node.next = peVar4;
      (piVar6->super_ir_instruction).super_exec_node.prev = &peVar3->head_sentinel;
      peVar4->prev = peVar8;
      (peVar3->head_sentinel).next = peVar8;
      piVar6 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
      ir_variable::ir_variable(piVar6,&glsl_type::_int_type,"gl_VertexIDMESA",ir_var_system_value);
      this->gl_VertexID = piVar6;
      *(uint *)&piVar6->data = *(uint *)&piVar6->data & 0xfffff3ff | 0x800;
      piVar1 = &this->gl_VertexID->data;
      *(uint *)piVar1 = *(uint *)piVar1 | 1;
      piVar6 = this->gl_VertexID;
      (piVar6->data).location = 0xc;
      puVar2 = &(piVar6->data).field_0x2;
      *puVar2 = *puVar2 | 4;
      piVar1 = &this->gl_VertexID->data;
      *(uint *)piVar1 = *(uint *)piVar1 & 0xfff7ffff;
      peVar8 = &(this->gl_VertexID->super_ir_instruction).super_exec_node;
      if (this->gl_VertexID == (ir_variable *)0x0) {
        peVar8 = (exec_node *)0x0;
      }
      peVar3 = this->ir_list;
      peVar4 = (peVar3->head_sentinel).next;
      peVar8->next = peVar4;
      peVar8->prev = &peVar3->head_sentinel;
      peVar4->prev = peVar8;
      (peVar3->head_sentinel).next = peVar8;
      if (this->gl_BaseVertex == (ir_variable *)0x0) {
        piVar6 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
        ir_variable::ir_variable(piVar6,&glsl_type::_int_type,"gl_BaseVertex",ir_var_system_value);
        this->gl_BaseVertex = piVar6;
        puVar2 = &(piVar6->data).field_0x1;
        *puVar2 = *puVar2 | 0xc;
        piVar1 = &this->gl_BaseVertex->data;
        *(uint *)piVar1 = *(uint *)piVar1 | 1;
        piVar6 = this->gl_BaseVertex;
        (piVar6->data).location = 0xd;
        puVar2 = &(piVar6->data).field_0x2;
        *puVar2 = *puVar2 | 4;
        piVar1 = &this->gl_BaseVertex->data;
        *(uint *)piVar1 = *(uint *)piVar1 & 0xfff7ffff;
        peVar3 = this->ir_list;
        peVar8 = &(this->gl_BaseVertex->super_ir_instruction).super_exec_node;
        if (this->gl_BaseVertex == (ir_variable *)0x0) {
          peVar8 = (exec_node *)0x0;
        }
        peVar4 = (peVar3->head_sentinel).next;
        peVar8->next = peVar4;
        peVar8->prev = &peVar3->head_sentinel;
        peVar4->prev = peVar8;
        (peVar3->head_sentinel).next = peVar8;
      }
      ir_builder::deref::deref(&local_30,this->VertexID);
      ir_builder::operand::operand(&local_38,this->gl_VertexID);
      ir_builder::operand::operand(&local_40,this->gl_BaseVertex);
      rhs.val = &ir_builder::add(local_38,local_40)->super_ir_rvalue;
      piVar7 = ir_builder::assign(local_30,rhs);
      piVar5 = this->main_sig;
      peVar8 = &(piVar7->super_ir_instruction).super_exec_node;
      if (piVar7 == (ir_assignment *)0x0) {
        peVar8 = (exec_node *)0x0;
      }
      peVar4 = (piVar5->body).head_sentinel.next;
      peVar8->next = peVar4;
      peVar8->prev = &(piVar5->body).head_sentinel;
      peVar4->prev = peVar8;
      (piVar5->body).head_sentinel.next = peVar8;
      piVar6 = this->VertexID;
    }
    ir->var = piVar6;
    (this->super_ir_hierarchical_visitor).field_0x31 = 1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_vertex_id_visitor::visit(ir_dereference_variable *ir)
{
   if (ir->var->data.mode != ir_var_system_value ||
       ir->var->data.location != SYSTEM_VALUE_VERTEX_ID)
      return visit_continue;

   if (VertexID == NULL) {
      const glsl_type *const int_t = glsl_type::int_type;
      void *const mem_ctx = ralloc_parent(ir);

      VertexID = new(mem_ctx) ir_variable(int_t, "__VertexID",
                                          ir_var_temporary);
      ir_list->push_head(VertexID);

      gl_VertexID = new(mem_ctx) ir_variable(int_t, "gl_VertexIDMESA",
                                             ir_var_system_value);
      gl_VertexID->data.how_declared = ir_var_declared_implicitly;
      gl_VertexID->data.read_only = true;
      gl_VertexID->data.location = SYSTEM_VALUE_VERTEX_ID_ZERO_BASE;
      gl_VertexID->data.explicit_location = true;
      gl_VertexID->data.explicit_index = 0;
      ir_list->push_head(gl_VertexID);

      if (gl_BaseVertex == NULL) {
         gl_BaseVertex = new(mem_ctx) ir_variable(int_t, "gl_BaseVertex",
                                                  ir_var_system_value);
         gl_BaseVertex->data.how_declared = ir_var_hidden;
         gl_BaseVertex->data.read_only = true;
         gl_BaseVertex->data.location = SYSTEM_VALUE_BASE_VERTEX;
         gl_BaseVertex->data.explicit_location = true;
         gl_BaseVertex->data.explicit_index = 0;
         ir_list->push_head(gl_BaseVertex);
      }

      ir_instruction *const inst =
         ir_builder::assign(VertexID,
                            ir_builder::add(gl_VertexID, gl_BaseVertex));

      main_sig->body.push_head(inst);
   }

   ir->var = VertexID;
   progress = true;

   return visit_continue;
}